

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

void chrono::ChBezierCurve::solveTriDiag(size_t n,double *rhs,double *x)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  
  pvVar4 = operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  *x = *rhs * 0.5;
  dVar8 = 2.0;
  for (uVar6 = 1; uVar6 < n; uVar6 = uVar6 + 1) {
    dVar1 = *(double *)(&DAT_00e64b40 + (ulong)(uVar6 < n - 1) * 8);
    *(double *)((long)pvVar4 + uVar6 * 8) = 1.0 / dVar8;
    dVar8 = dVar1 - 1.0 / dVar8;
    x[uVar6] = (rhs[uVar6] - x[uVar6 - 1]) / dVar8;
  }
  uVar6 = 1;
  lVar3 = n * 8;
  while (lVar5 = lVar3 + -8, uVar6 < n) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)((long)pvVar4 + lVar5);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)((long)x + lVar5);
    uVar6 = uVar6 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)((long)x + lVar3 + -0x10);
    auVar2 = vfnmadd213sd_fma(auVar9,auVar7,auVar2);
    *(long *)((long)x + lVar3 + -0x10) = auVar2._0_8_;
    lVar3 = lVar5;
  }
  operator_delete__(pvVar4);
  return;
}

Assistant:

void ChBezierCurve::solveTriDiag(size_t n, double* rhs, double* x) {
    double* tmp = new double[n];

    double b = 2.0;
    x[0] = rhs[0] / b;

    // Decomposition and forward substitution.
    for (size_t i = 1; i < n; i++) {
        tmp[i] = 1 / b;
        b = (i < n - 1 ? 4.0 : 3.5) - tmp[i];
        x[i] = (rhs[i] - x[i - 1]) / b;
    }

    // Backsubstitution.
    for (size_t i = 1; i < n; i++)
        x[n - i - 1] -= tmp[n - i] * x[n - i];

    delete[] tmp;
}